

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::DiskSourceTree::DiskSourceTree(DiskSourceTree *this)

{
  (this->super_SourceTree)._vptr_SourceTree = (_func_int **)&PTR__DiskSourceTree_003b8cc8;
  (this->mappings_).
  super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings_).
  super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mappings_).
  super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->last_error_message_)._M_dataplus._M_p = (pointer)&(this->last_error_message_).field_2;
  (this->last_error_message_)._M_string_length = 0;
  (this->last_error_message_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

DiskSourceTree::DiskSourceTree() {}